

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O2

void __thiscall YAJLTables::fetch_qtable(YAJLTables *this,bitio_stream *bstream)

{
  ulong uVar1;
  ssize_t sVar2;
  size_t in_RCX;
  void *in_RDX;
  int iVar3;
  bool bVar4;
  YAJLQTable table;
  
  sVar2 = bitio::bitio_stream::read(bstream,0x10,in_RDX,in_RCX);
  for (iVar3 = (int)sVar2 + -2; iVar3 != 0; iVar3 = iVar3 + (uint)bVar4 * 0x40 + -0x81) {
    YAJLQTable::YAJLQTable(&table,bstream);
    bVar4 = table.precision == '\0';
    uVar1 = (ulong)table.dest_id;
    this->qtables[uVar1].precision = table.precision;
    this->qtables[uVar1].dest_id = table.dest_id;
    this->qtables[uVar1].coeffs = table.coeffs;
  }
  return;
}

Assistant:

void YAJLTables::fetch_qtable(bitio::bitio_stream *bstream) {
    u32 seg_len = bstream->read(0x10);
    // exclude size of Lq which is 2 bytes
    seg_len -= 2;
    while (seg_len > 0) {
        YAJLQTable table(bstream);
        u8 qk_size = table.precision == 0 ? 8 : 16;
        qtables[table.dest_id] = table;
        seg_len -= 1 + (qk_size << 3);
    }
}